

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O0

void write_signed<int>(raw_ostream *S,int N,size_t MinDigits,IntegerStyle Style)

{
  UnsignedT UN;
  IntegerStyle Style_local;
  size_t MinDigits_local;
  int N_local;
  raw_ostream *S_local;
  
  if (N < 0) {
    write_unsigned<unsigned_int>(S,-N,MinDigits,Style,true);
  }
  else {
    write_unsigned<unsigned_int>(S,N,MinDigits,Style,false);
  }
  return;
}

Assistant:

static void write_signed(raw_ostream &S, T N, size_t MinDigits,
                         IntegerStyle Style) {
  static_assert(std::is_signed<T>::value, "Value is not signed!");

  using UnsignedT = typename std::make_unsigned<T>::type;

  if (N >= 0) {
    write_unsigned(S, static_cast<UnsignedT>(N), MinDigits, Style);
    return;
  }

  UnsignedT UN = -(UnsignedT)N;
  write_unsigned(S, UN, MinDigits, Style, true);
}